

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O0

Word32 pow2(tetra_codec *st,Word16 exponant,Word16 fraction)

{
  Word16 WVar1;
  Word16 WVar2;
  Word32 WVar3;
  Word16 var2;
  Word16 in_DX;
  undefined2 in_SI;
  Word32 L_x;
  Word16 tmp;
  Word16 a;
  Word16 i;
  Word16 exp;
  undefined2 uVar4;
  Word32 in_stack_ffffffffffffffec;
  uint uVar5;
  Word32 L_var3;
  undefined2 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff2;
  
  WVar3 = L_deposit_l(in_DX);
  WVar3 = L_shl((tetra_codec *)
                CONCAT26(in_SI,CONCAT24(in_DX,CONCAT22(in_stack_fffffffffffffff2,
                                                       in_stack_fffffffffffffff0))),
                in_stack_ffffffffffffffec,(Word16)((uint)WVar3 >> 0x10));
  WVar1 = extract_h(WVar3);
  WVar3 = L_shr((tetra_codec *)
                CONCAT26(in_SI,CONCAT24(in_DX,CONCAT22(in_stack_fffffffffffffff2,WVar1))),
                in_stack_ffffffffffffffec,(Word16)((uint)WVar3 >> 0x10));
  uVar4 = (undefined2)in_stack_ffffffffffffffec;
  WVar2 = extract_l(WVar3);
  uVar5 = CONCAT22(WVar2,uVar4) & 0x7fffffff;
  WVar3 = L_deposit_h(tab_pow2[WVar1]);
  WVar2 = sub((tetra_codec *)
              CONCAT26(in_SI,CONCAT24(in_DX,CONCAT22(in_stack_fffffffffffffff2,WVar1))),
              (Word16)(uVar5 >> 0x10),(Word16)uVar5);
  L_var3 = CONCAT22((short)(uVar5 >> 0x10),WVar2);
  WVar3 = L_msu((tetra_codec *)
                CONCAT26(in_SI,CONCAT24(in_DX,CONCAT22(in_stack_fffffffffffffff2,WVar1))),L_var3,
                (Word16)((uint)WVar3 >> 0x10),(Word16)WVar3);
  var2 = (Word16)((uint)WVar3 >> 0x10);
  WVar2 = sub((tetra_codec *)
              CONCAT26(in_SI,CONCAT24(in_DX,CONCAT22(in_stack_fffffffffffffff2,WVar1))),
              (Word16)((uint)L_var3 >> 0x10),(Word16)L_var3);
  WVar3 = L_shr_r((tetra_codec *)CONCAT26(in_SI,CONCAT24(in_DX,CONCAT22(WVar2,WVar1))),L_var3,var2);
  return WVar3;
}

Assistant:

Word32 pow2(tetra_codec* st, Word16 exponant, Word16 fraction)
{
  Word16 exp, i, a, tmp;
  Word32 L_x;

  L_x = L_deposit_l(fraction);
  L_x = L_shl(st, L_x, (Word16)6 );
  i   = extract_h(L_x);				/* Extract b10-b16 of fraction */
  L_x = L_shr(st, L_x, (Word16)1 );
  a   = extract_l(L_x);				/* Extract b0-b9   of fraction */
  a   = a & (Word16)0x7fff;


  L_x = L_deposit_h(tab_pow2[i]);		/* tab_pow2[i] << 16 */
  tmp = sub(st, tab_pow2[i], tab_pow2[i+1]);	/* tab_pow2[i] - tab_pow2[i+1] */
  L_x = L_msu(st, L_x, tmp, a);			/* L_x -= tmp*a*2  */

  exp = sub(st,  (Word16)30, exponant );
  L_x = L_shr_r(st, L_x, exp);
  return(L_x);
}